

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O0

void NLW2_DestroyNLSolver_C(NLW2_NLSolver_C *pnls)

{
  void *pvVar1;
  undefined8 *in_RDI;
  NLSolver *in_stack_ffffffffffffffe0;
  
  if (in_RDI[2] != 0) {
    pvVar1 = (void *)in_RDI[2];
    if (pvVar1 != (void *)0x0) {
      mp::NLW2_Solution_C_Data::~NLW2_Solution_C_Data
                ((NLW2_Solution_C_Data *)in_stack_ffffffffffffffe0);
      operator_delete(pvVar1,0xa8);
    }
    in_RDI[2] = 0;
  }
  pvVar1 = (void *)*in_RDI;
  if (pvVar1 != (void *)0x0) {
    mp::NLSolver::~NLSolver(in_stack_ffffffffffffffe0);
    operator_delete(pvVar1,200);
  }
  *in_RDI = 0;
  if (in_RDI[1] != 0) {
    if ((long *)in_RDI[1] != (long *)0x0) {
      (**(code **)(*(long *)in_RDI[1] + 8))();
    }
    in_RDI[1] = 0;
  }
  return;
}

Assistant:

void NLW2_DestroyNLSolver_C(NLW2_NLSolver_C* pnls) {
  if (pnls->p_sol_) {
    delete (mp::NLW2_Solution_C_Data*)pnls->p_sol_;
    pnls->p_sol_ = nullptr;
  }
  delete (mp::NLSOL_C_Impl*)(pnls->p_nlsol_);
  pnls->p_nlsol_ = nullptr;
  if (pnls->p_utl_) {
    delete (mp::NLUtils_C_Impl*)(pnls->p_utl_);
    pnls->p_utl_ = nullptr;
  }
}